

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.h
# Opt level: O1

void __thiscall CVmFormatterBanner::reset_line_count(CVmFormatterBanner *this,int clearing)

{
  (this->super_CVmFormatterDisp).super_CVmFormatter.linecnt_ = (uint)(clearing == 0);
  return;
}

Assistant:

virtual void reset_line_count(int clearing)
    {
        /* 
         *   To ensure we always keep a line of context when we page-forward
         *   from a MORE prompt, start the line counter at 2.  Note that we
         *   do this in banner windows, but not in the main window, because -
         *   for historical reasons - the OS layer tells us the *paging* size
         *   for the main window, but the *actual* height for banner window.
         *   Note that we don't want to handle this adjustment in our own
         *   page length calculation, because doing so would cause the
         *   *first* MORE prompt (from a cleared window) to show up too
         *   early.
         *   
         *   When we're clearing the screen, reset to zero, since we have no
         *   context to retain.  
         */
        linecnt_ = (clearing ? 0 : 1);
    }